

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall sznet::net::Buffer::makeSpace(Buffer *this,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  size_type sVar3;
  size_t len_local;
  Buffer *this_local;
  
  sVar1 = writableBytes(this);
  sVar2 = prependableBytes(this);
  if (sVar1 + sVar2 < len + this->m_nCheapPrepend) {
    std::vector<char,_std::allocator<char>_>::resize(&this->m_buffer,this->m_writerIndex + len);
    sVar3 = std::vector<char,_std::allocator<char>_>::capacity(&this->m_buffer);
    this->m_wrapSize = sVar3 * 3 >> 2;
  }
  else {
    if (this->m_readerIndex <= this->m_nCheapPrepend) {
      __assert_fail("m_nCheapPrepend < m_readerIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                    ,0x18e,"void sznet::net::Buffer::makeSpace(size_t)");
    }
    wrapBuffer(this);
  }
  return;
}

Assistant:

void makeSpace(size_t len)
	{
		if (writableBytes() + prependableBytes() < len + m_nCheapPrepend)
		{
			// ������ȷʵ������
			// FIXME: move readable data
			m_buffer.resize(m_writerIndex + len);
			m_wrapSize = m_buffer.capacity() * 3 / 4;
		}
		else
		{
			// ����
			assert(m_nCheapPrepend < m_readerIndex);
			wrapBuffer();
		}
	}